

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureFilteringExplicitLodTests.cpp
# Opt level: O0

VkImageViewType vkt::texture::anon_unknown_3::mapImageViewType(ImageViewParameters *imParams)

{
  ImgDim IVar1;
  VkImageViewType local_14;
  VkImageViewType imViewType;
  ImageViewParameters *imParams_local;
  
  if ((imParams->isArrayed & 1U) == 0) {
    switch(imParams->dim) {
    case IMG_DIM_1D:
      local_14 = VK_IMAGE_VIEW_TYPE_1D;
      break;
    case IMG_DIM_2D:
      local_14 = VK_IMAGE_VIEW_TYPE_2D;
      break;
    case IMG_DIM_3D:
      local_14 = VK_IMAGE_VIEW_TYPE_3D;
      break;
    case IMG_DIM_CUBE:
      local_14 = VK_IMAGE_VIEW_TYPE_CUBE;
      break;
    default:
      local_14 = VK_IMAGE_VIEW_TYPE_LAST;
    }
  }
  else {
    IVar1 = imParams->dim;
    if (IVar1 == IMG_DIM_1D) {
      local_14 = VK_IMAGE_VIEW_TYPE_1D_ARRAY;
    }
    else if (IVar1 == IMG_DIM_2D) {
      local_14 = VK_IMAGE_VIEW_TYPE_2D_ARRAY;
    }
    else if (IVar1 == IMG_DIM_CUBE) {
      local_14 = VK_IMAGE_VIEW_TYPE_CUBE_ARRAY;
    }
    else {
      local_14 = VK_IMAGE_VIEW_TYPE_LAST;
    }
  }
  return local_14;
}

Assistant:

VkImageViewType mapImageViewType (const ImageViewParameters& imParams)
{
	VkImageViewType imViewType;

	if (imParams.isArrayed)
	{
		switch (imParams.dim)
		{
			case IMG_DIM_1D:
				imViewType = VK_IMAGE_VIEW_TYPE_1D_ARRAY;
				break;

			case IMG_DIM_2D:
				imViewType = VK_IMAGE_VIEW_TYPE_2D_ARRAY;
				break;

			case IMG_DIM_CUBE:
				imViewType = VK_IMAGE_VIEW_TYPE_CUBE_ARRAY;
				break;

			default:
				imViewType = VK_IMAGE_VIEW_TYPE_LAST;
				break;
		}
	}
	else
	{
		switch (imParams.dim)
		{
			case IMG_DIM_1D:
				imViewType = VK_IMAGE_VIEW_TYPE_1D;
				break;

			case IMG_DIM_2D:
				imViewType = VK_IMAGE_VIEW_TYPE_2D;
				break;

			case IMG_DIM_3D:
				imViewType = VK_IMAGE_VIEW_TYPE_3D;
				break;

			case IMG_DIM_CUBE:
				imViewType = VK_IMAGE_VIEW_TYPE_CUBE;
				break;

			default:
				imViewType = VK_IMAGE_VIEW_TYPE_LAST;
				break;
		}
	}

	return imViewType;
}